

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O1

void Imf_3_4::anon_unknown_1::insertChannels(Header *header,RgbaChannels rgbaChannels)

{
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
  *this;
  ChannelList ch;
  Channel local_50;
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
  local_40;
  
  local_40._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_40._M_impl.super__Rb_tree_header._M_header;
  local_40._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_40._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40._M_impl.super__Rb_tree_header._M_header._M_right =
       local_40._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((rgbaChannels & WRITE_YC) == 0) {
    if ((rgbaChannels & WRITE_R) != 0) {
      Channel::Channel(&local_50,HALF,1,1,false);
      ChannelList::insert((ChannelList *)&local_40,"R",&local_50);
    }
    if ((rgbaChannels & WRITE_G) != 0) {
      Channel::Channel(&local_50,HALF,1,1,false);
      ChannelList::insert((ChannelList *)&local_40,"G",&local_50);
    }
    if ((rgbaChannels & WRITE_B) != 0) {
      Channel::Channel(&local_50,HALF,1,1,false);
      ChannelList::insert((ChannelList *)&local_40,"B",&local_50);
    }
  }
  else {
    if ((rgbaChannels & WRITE_Y) != 0) {
      Channel::Channel(&local_50,HALF,1,1,false);
      ChannelList::insert((ChannelList *)&local_40,"Y",&local_50);
    }
    if ((rgbaChannels & WRITE_C) != 0) {
      Channel::Channel(&local_50,HALF,2,2,true);
      ChannelList::insert((ChannelList *)&local_40,"RY",&local_50);
      Channel::Channel(&local_50,HALF,2,2,true);
      ChannelList::insert((ChannelList *)&local_40,"BY",&local_50);
    }
  }
  if ((rgbaChannels & WRITE_A) != 0) {
    Channel::Channel(&local_50,HALF,1,1,false);
    ChannelList::insert((ChannelList *)&local_40,"A",&local_50);
  }
  this = (_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
          *)Header::channels(header);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
  ::operator=(this,&local_40);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
  ::~_Rb_tree(&local_40);
  return;
}

Assistant:

void
insertChannels (Header& header, RgbaChannels rgbaChannels)
{
    ChannelList ch;

    if (rgbaChannels & (WRITE_Y | WRITE_C))
    {
        if (rgbaChannels & WRITE_Y) { ch.insert ("Y", Channel (HALF, 1, 1)); }

        if (rgbaChannels & WRITE_C)
        {
            ch.insert ("RY", Channel (HALF, 2, 2, true));
            ch.insert ("BY", Channel (HALF, 2, 2, true));
        }
    }
    else
    {
        if (rgbaChannels & WRITE_R) ch.insert ("R", Channel (HALF, 1, 1));

        if (rgbaChannels & WRITE_G) ch.insert ("G", Channel (HALF, 1, 1));

        if (rgbaChannels & WRITE_B) ch.insert ("B", Channel (HALF, 1, 1));
    }

    if (rgbaChannels & WRITE_A) ch.insert ("A", Channel (HALF, 1, 1));

    header.channels () = ch;
}